

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O2

UChar32 utf8_prevCharSafeBody_63(uint8_t *s,int32_t start,int32_t *pi,UChar32 c,UBool strict)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  UChar32 UVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  int iVar9;
  uint uVar10;
  
  iVar3 = *pi;
  if (start < iVar3 && (char)c < -0x40) {
    iVar9 = iVar3 + -1;
    bVar1 = s[(long)iVar3 + -1];
    uVar4 = (uint)bVar1;
    if ((byte)(bVar1 + 0x3e) < 0x33) {
      if (bVar1 < 0xe0) {
        *pi = iVar9;
        return uVar4 * 0x40 + (c & 0x3fU) + -0x3000;
      }
      if (bVar1 < 0xf0) {
        pbVar8 = (byte *)(" 000000000000\x1000" + (uVar4 & 0xf));
        uVar4 = (uint)c >> 5 & 5;
      }
      else {
        pbVar8 = (byte *)("" + ((uint)c >> 4 & 0xb));
        uVar4 = uVar4 & 7;
      }
      if ((*pbVar8 >> uVar4 & 1) != 0) {
        *pi = iVar9;
        UVar5 = 0x9f;
LAB_002e98da:
        if (-1 < strict) {
          return UVar5;
        }
        goto LAB_002e996b;
      }
    }
    else if (start < iVar9 && (char)bVar1 < -0x40) {
      uVar6 = c & 0x3f;
      iVar9 = iVar3 + -2;
      bVar2 = s[(long)iVar3 + -2];
      uVar10 = (uint)bVar2;
      if ((byte)(bVar2 + 0x20) < 0x15) {
        if (bVar2 < 0xf0) {
          uVar10 = uVar10 & 0xf;
          if (strict == -2) {
            if ((0x1f < (byte)(uVar4 & 0x3f)) || ((char)uVar10 != '\0')) {
              *pi = iVar9;
              return (uVar4 & 0x3f) << 6 | uVar10 << 0xc | uVar6;
            }
            goto LAB_002e996b;
          }
          if (((byte)" 000000000000\x1000"[uVar10] >> (bVar1 >> 5) & 1) != 0) {
            *pi = iVar9;
            uVar6 = (uVar4 & 0x3f) << 6 | uVar10 << 0xc | uVar6;
            if (strict < '\x01') {
              return uVar6;
            }
            if (uVar6 < 0xfdd0) {
              return uVar6;
            }
            uVar4 = uVar6;
            if ((~uVar6 & 0xfffe) == 0) {
              uVar4 = 0xffff;
            }
            if (0xfdef < uVar6) {
              return uVar4;
            }
            return 0xffff;
          }
        }
        else if (((byte)""[bVar1 >> 4] >> (uVar10 & 7) & 1) != 0) {
          *pi = iVar9;
          UVar5 = 0xffff;
          goto LAB_002e98da;
        }
      }
      else if (((start < iVar9 && (char)bVar2 < -0x40) && ((byte)(s[(long)iVar3 + -3] + 0x10) < 5))
              && (uVar7 = s[(long)iVar3 + -3] & 7, ((byte)""[bVar2 >> 4] >> uVar7 & 1) != 0)) {
        *pi = iVar3 + -3;
        uVar10 = (uVar10 & 0x3f) << 0xc | uVar7 << 0x12;
        uVar4 = (uVar4 & 0x3f) << 6 | uVar6 | uVar10;
        if (strict < '\x01') {
          return uVar4;
        }
        if (uVar4 < 0xfdd0) {
          return uVar4;
        }
        if (0xfdef < uVar4) {
          if ((~uVar4 & 0xfffe) != 0) {
            return uVar4;
          }
          if (0x10ffff < uVar10) {
            return uVar4;
          }
        }
        return 0x10ffff;
      }
    }
  }
  if (-1 < strict) {
    return 0x15;
  }
LAB_002e996b:
  return -(uint)(strict != -3) | 0xfffd;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utf8_prevCharSafeBody(const uint8_t *s, int32_t start, int32_t *pi, UChar32 c, UBool strict) {
    // *pi is the index of byte c.
    int32_t i=*pi;
    if(U8_IS_TRAIL(c) && i>start) {
        uint8_t b1=s[--i];
        if(U8_IS_LEAD(b1)) {
            if(b1<0xe0) {
                *pi=i;
                return ((b1-0xc0)<<6)|(c&0x3f);
            } else if(b1<0xf0 ? U8_IS_VALID_LEAD3_AND_T1(b1, c) : U8_IS_VALID_LEAD4_AND_T1(b1, c)) {
                // Truncated 3- or 4-byte sequence.
                *pi=i;
                return errorValue(1, strict);
            }
        } else if(U8_IS_TRAIL(b1) && i>start) {
            // Extract the value bits from the last trail byte.
            c&=0x3f;
            uint8_t b2=s[--i];
            if(0xe0<=b2 && b2<=0xf4) {
                if(b2<0xf0) {
                    b2&=0xf;
                    if(strict!=-2) {
                        if(U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                            *pi=i;
                            c=(b2<<12)|((b1&0x3f)<<6)|c;
                            if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                                return c;
                            } else {
                                // strict: forbid non-characters like U+fffe
                                return errorValue(2, strict);
                            }
                        }
                    } else {
                        // strict=-2 -> lenient: allow surrogates
                        b1-=0x80;
                        if((b2>0 || b1>=0x20)) {
                            *pi=i;
                            return (b2<<12)|(b1<<6)|c;
                        }
                    }
                } else if(U8_IS_VALID_LEAD4_AND_T1(b2, b1)) {
                    // Truncated 4-byte sequence.
                    *pi=i;
                    return errorValue(2, strict);
                }
            } else if(U8_IS_TRAIL(b2) && i>start) {
                uint8_t b3=s[--i];
                if(0xf0<=b3 && b3<=0xf4) {
                    b3&=7;
                    if(U8_IS_VALID_LEAD4_AND_T1(b3, b2)) {
                        *pi=i;
                        c=(b3<<18)|((b2&0x3f)<<12)|((b1&0x3f)<<6)|c;
                        if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                            return c;
                        } else {
                            // strict: forbid non-characters like U+fffe
                            return errorValue(3, strict);
                        }
                    }
                }
            }
        }
    }
    return errorValue(0, strict);
}